

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O2

int libssh2_channel_setenv_ex
              (LIBSSH2_CHANNEL *channel,char *varname,uint varname_len,char *value,uint value_len)

{
  uchar uVar1;
  libssh2_nonblocking_states lVar2;
  LIBSSH2_SESSION *session;
  int iVar3;
  time_t start_time;
  uchar *puVar4;
  char *errmsg;
  ulong uVar5;
  uchar *local_78;
  uchar *local_70;
  time_t local_68;
  ulong local_60;
  ulong local_58;
  char *local_50;
  char *local_48;
  size_t local_40;
  uchar *data;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    iVar3 = -0x27;
  }
  else {
    local_50 = varname;
    local_48 = value;
    start_time = time((time_t *)0x0);
    uVar5 = (ulong)(varname_len + value_len + 0x15);
    local_70 = channel->setenv_local_channel;
    local_60 = (ulong)varname_len;
    local_58 = (ulong)value_len;
    do {
      session = channel->session;
      lVar2 = channel->setenv_state;
      if (lVar2 == libssh2_NB_state_sent) {
LAB_0010c56e:
        iVar3 = _libssh2_packet_requirev
                          (session,"cd",&data,&local_40,1,local_70,4,
                           &channel->setenv_packet_requirev_state);
        if (iVar3 != -0x25) {
          if (iVar3 == 0) {
            if (local_40 != 0) {
              uVar1 = *data;
              local_68 = start_time;
              (*session->free)(data,&session->abstract);
              start_time = local_68;
              if (uVar1 == 'c') {
                channel->setenv_state = libssh2_NB_state_idle;
                return 0;
              }
              goto LAB_0010c5dd;
            }
            channel->setenv_state = libssh2_NB_state_idle;
            iVar3 = -0xe;
            errmsg = "Unexpected packet size";
          }
          else {
            channel->setenv_state = libssh2_NB_state_idle;
            errmsg = "Failed getting response for channel-setenv";
          }
LAB_0010c65b:
          iVar3 = _libssh2_error(session,iVar3,errmsg);
          if (iVar3 != -0x25) {
            return iVar3;
          }
        }
      }
      else {
        if (lVar2 != libssh2_NB_state_created) {
          if (lVar2 == libssh2_NB_state_idle) {
            channel->setenv_packet_len = uVar5;
            (channel->setenv_packet_requirev_state).start = 0;
            puVar4 = (uchar *)(*session->alloc)(uVar5,&session->abstract);
            channel->setenv_packet = puVar4;
            if (puVar4 != (uchar *)0x0) {
              local_78 = puVar4 + 1;
              *puVar4 = 'b';
              _libssh2_store_u32(&local_78,(channel->remote).id);
              _libssh2_store_str(&local_78,"env",3);
              *local_78 = '\x01';
              local_78 = local_78 + 1;
              _libssh2_store_str(&local_78,local_50,local_60);
              _libssh2_store_str(&local_78,local_48,local_58);
              channel->setenv_state = libssh2_NB_state_created;
              goto LAB_0010c500;
            }
            iVar3 = -6;
            errmsg = "Unable to allocate memory for setenv packet";
          }
          else {
LAB_0010c5dd:
            channel->setenv_state = libssh2_NB_state_idle;
            iVar3 = -0x16;
            errmsg = "Unable to complete request for channel-setenv";
          }
          goto LAB_0010c65b;
        }
LAB_0010c500:
        iVar3 = _libssh2_transport_send
                          (session,channel->setenv_packet,channel->setenv_packet_len,(uchar *)0x0,0)
        ;
        if (iVar3 == 0) {
          (*session->free)(channel->setenv_packet,&session->abstract);
          channel->setenv_packet = (uchar *)0x0;
          _libssh2_htonu32(local_70,(channel->local).id);
          channel->setenv_state = libssh2_NB_state_sent;
          goto LAB_0010c56e;
        }
        if (iVar3 != -0x25) {
          (*session->free)(channel->setenv_packet,&session->abstract);
          channel->setenv_packet = (uchar *)0x0;
          channel->setenv_state = libssh2_NB_state_idle;
          iVar3 = -7;
          errmsg = "Unable to send channel-request packet for setenv request";
          goto LAB_0010c65b;
        }
        _libssh2_error(session,-0x25,"Would block sending setenv request");
      }
      if (channel->session->api_block_mode == 0) {
        return -0x25;
      }
      iVar3 = _libssh2_wait_socket(channel->session,start_time);
    } while (iVar3 == 0);
  }
  return iVar3;
}

Assistant:

LIBSSH2_API int
libssh2_channel_setenv_ex(LIBSSH2_CHANNEL *channel,
                          const char *varname, unsigned int varname_len,
                          const char *value, unsigned int value_len)
{
    int rc;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, channel->session,
                 channel_setenv(channel, varname, varname_len,
                                value, value_len));
    return rc;
}